

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnnoptimize.cpp
# Opt level: O0

int __thiscall NetOptimize::eliminate_orphaned_memorydata(NetOptimize *this)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  size_type sVar4;
  reference ppLVar5;
  reference pvVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  undefined8 uVar8;
  long in_RDI;
  int k;
  bool orphaned;
  int j;
  int top_blob_index;
  int i;
  int layer_count;
  FILE *in_stack_ffffffffffffffc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  int local_20;
  int local_18;
  int local_10;
  
  sVar4 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::size
                    ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)(in_RDI + 0x40));
  iVar3 = (int)sVar4;
  local_10 = 0;
  do {
    if (iVar3 <= local_10) {
      return 0;
    }
    std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
              ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)(in_RDI + 0x40),
               (long)local_10);
    bVar2 = std::operator!=(in_stack_ffffffffffffffd0,(char *)in_stack_ffffffffffffffc8);
    if (!bVar2) {
      ppLVar5 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                          ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)(in_RDI + 0x40),
                           (long)local_10);
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&(*ppLVar5)->tops,0);
      iVar1 = *pvVar6;
      local_18 = local_10;
      do {
        do {
          local_18 = local_18 + 1;
          if (iVar3 <= local_18) goto LAB_00118eaa;
          std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                    ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)(in_RDI + 0x40),
                     (long)local_18);
          bVar2 = std::operator==(in_stack_ffffffffffffffd0,(char *)in_stack_ffffffffffffffc8);
        } while (bVar2);
        bVar2 = true;
        local_20 = 0;
        while( true ) {
          in_stack_ffffffffffffffd0 =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(long)local_20;
          ppLVar5 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                              ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                               (in_RDI + 0x40),(long)local_18);
          pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   std::vector<int,_std::allocator<int>_>::size(&(*ppLVar5)->bottoms);
          if (pbVar7 <= in_stack_ffffffffffffffd0) break;
          ppLVar5 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                              ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                               (in_RDI + 0x40),(long)local_18);
          pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                             (&(*ppLVar5)->bottoms,(long)local_20);
          if (*pvVar6 == iVar1) {
            bVar2 = false;
            break;
          }
          local_20 = local_20 + 1;
        }
      } while (bVar2);
LAB_00118eaa:
      if (iVar3 <= local_18) {
        in_stack_ffffffffffffffc8 = _stderr;
        std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                  ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)(in_RDI + 0x40),
                   (long)local_10);
        uVar8 = std::__cxx11::string::c_str();
        fprintf(in_stack_ffffffffffffffc8,"eliminate_orphaned_memorydata %s\n",uVar8);
        ppLVar5 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                            ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                             (in_RDI + 0x40),(long)local_10);
        std::__cxx11::string::operator=((string *)&(*ppLVar5)->type,"ncnnfused");
      }
    }
    local_10 = local_10 + 1;
  } while( true );
}

Assistant:

int NetOptimize::eliminate_orphaned_memorydata()
{
    const int layer_count = layers.size();
    for (int i=0; i<layer_count; i++)
    {
        if (layers[i]->type != "MemoryData")
            continue;

        // MemoryData - X
        int top_blob_index = layers[i]->tops[0];

        int j = i + 1;
        for (; j<layer_count; j++)
        {
            if (layers[j]->type == "ncnnfused")
                continue;

            bool orphaned = true;
            for (int k=0; k<layers[j]->bottoms.size(); k++)
            {
                if (layers[j]->bottoms[k] == top_blob_index)
                {
                    orphaned = false;
                    break;
                }
            }

            if (!orphaned)
                break;
        }

        if (j < layer_count)
            continue;

        // assert orphaned == true
        fprintf(stderr, "eliminate_orphaned_memorydata %s\n", layers[i]->name.c_str());

        layers[i]->type = "ncnnfused";
    }

    return 0;
}